

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_optimize_and_flush_block
               (libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
               u32 block_length,lz_match *cache_ptr,_Bool is_first_block,_Bool is_final_block,
               _Bool *used_only_literals)

{
  u32 *puVar1;
  void *pvVar2;
  void *pvVar3;
  deflate_lens *lens;
  byte bVar4;
  byte bVar5;
  u32 uVar6;
  u32 uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  deflate_sequence *sequences;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint local_54;
  uint local_44;
  deflate_sequence seq_;
  
  uVar12 = (ulong)block_length;
  local_44 = (c->p).n.max_optim_passes;
  deflate_choose_all_literals(c,block_begin,block_length);
  uVar6 = deflate_compute_true_cost(c);
  uVar9 = 0x4a767;
  uVar19 = uVar12;
  if (block_length + 0x101 < 0x4a768) {
    uVar9 = (ulong)(block_length + 0x101);
  }
  for (; uVar19 <= uVar9; uVar19 = uVar19 + 1) {
    *(undefined4 *)((long)&c->p + uVar19 * 8 + 0x639584) = 0x80000000;
  }
  if ((c->p).n.max_len_to_optimize_static_block < block_length) {
    local_54 = 0xffffffff;
  }
  else {
    pvVar2 = (void *)((long)&c->p + 0x88d950);
    pvVar3 = (void *)((long)&c->p + 0x88d0c4);
    memcpy(pvVar2,pvVar3,0x88c);
    deflate_set_costs_from_codes(c,&(c->static_codes).lens);
    deflate_find_min_cost_path(c,block_length,cache_ptr);
    local_54 = ((c->p).n.optimum_nodes[0].cost_to_end >> 4) + 7;
    memcpy(pvVar3,pvVar2,0x88c);
  }
  memset(&c->freqs,0,0x400);
  for (uVar19 = 0; uVar12 != uVar19; uVar19 = uVar19 + 1) {
    puVar1 = (c->freqs).litlen + block_begin[uVar19];
    *puVar1 = *puVar1 + 1;
  }
  iVar14 = 0;
  for (lVar11 = 10; lVar11 != 0x10a; lVar11 = lVar11 + 1) {
    iVar14 = iVar14 + (uint)(block_length >> 0xb < (c->freqs).litlen[lVar11 + -10]);
  }
  uVar15 = iVar14 + (uint)(iVar14 == 0);
  uVar7 = choose_min_match_len(uVar15,c->max_search_depth);
  uVar8 = 0;
  for (uVar19 = (ulong)uVar7; uVar10 = (uint)uVar12, uVar19 != 0x103; uVar19 = uVar19 + 1) {
    iVar14 = *(int *)((long)&c->p + uVar19 * 4 + 0x896618);
    uVar8 = uVar8 + iVar14;
    uVar12 = (ulong)(uVar10 - (int)uVar19 * iVar14);
  }
  uVar13 = 0;
  if (0 < (int)uVar10) {
    uVar13 = uVar10;
  }
  uVar19 = 2;
  if (uVar8 <= uVar13) {
    uVar19 = (ulong)(uVar13 < uVar8 * 4);
  }
  bVar4 = default_litlen_costs[uVar19].used_lits_to_lit_cost[uVar15];
  bVar5 = default_litlen_costs[uVar19].len_sym_cost;
  if (is_first_block) {
LAB_00106b22:
    for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
      *(uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4) = (uint)bVar4;
    }
    for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
      *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) = (uint)""[""[lVar11 + 3]] * 0x10 + (uint)bVar5
      ;
    }
    for (lVar11 = 0; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
      *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) = (uint)""[lVar11] * 0x10 + 0x4e;
    }
  }
  else {
    uVar9 = (ulong)(c->split_stats).num_observations;
    uVar12 = (ulong)(c->p).n.prev_num_observations;
    uVar19 = 0;
    for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
      uVar16 = *(uint *)((long)&c->p + lVar11 * 4 + 0x8961e0) * uVar9;
      uVar17 = (c->split_stats).observations[lVar11] * uVar12;
      lVar18 = uVar17 - uVar16;
      if (uVar17 < uVar16) {
        lVar18 = -(uVar17 - uVar16);
      }
      uVar19 = uVar19 + lVar18;
    }
    uVar9 = uVar9 * uVar12 * 200 >> 9;
    if (uVar9 * 3 < uVar19) goto LAB_00106b22;
    if (uVar19 * 4 < uVar9 * 9 || uVar19 * 4 + uVar9 * -9 == 0) {
      if (uVar9 * 3 < uVar19 * 2) {
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4) =
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d0c4) * 3 + (uint)bVar4 + (uint)bVar4 * 4 >>
               3;
        }
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) * 3 +
               ((uint)""[""[lVar11 + 3]] * 0x10 + (uint)bVar5) * 5 >> 3;
        }
        for (lVar11 = 0; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
               (uint)""[lVar11] * 0x50 + *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) * 3 + 0x186
               >> 3;
        }
      }
      else if (uVar9 < uVar19 * 2) {
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4) =
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d0c4) + (uint)bVar4 >> 1;
        }
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) + (uint)bVar5 +
               (uint)""[""[lVar11 + 3]] * 0x10 >> 1;
        }
        for (lVar11 = 0; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
               (uint)""[lVar11] * 0x10 + *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) + 0x4e >> 1;
        }
      }
      else {
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4) =
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d0c4) * 3 + (uint)bVar4 >> 2;
        }
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) * 3 + (uint)bVar5 +
               (uint)""[""[lVar11 + 3]] * 0x10 >> 2;
        }
        for (lVar11 = 0; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
               (uint)""[lVar11] * 0x10 + *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) * 3 + 0x4e >>
               2;
        }
      }
    }
    else {
      for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
        *(uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4) =
             *(int *)((long)&c->p + lVar11 * 4 + 0x88d0c4) + (uint)bVar4 + (uint)bVar4 * 2 >> 2;
      }
      for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
        *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
             ((uint)""[""[lVar11 + 3]] * 0x10 + (uint)bVar5) * 3 +
             *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) >> 2;
      }
      for (lVar11 = 0; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
        *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
             (uint)""[lVar11] * 0x30 + *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) + 0xea >> 2;
      }
    }
  }
  pvVar2 = (void *)((long)&c->p + 0x88d950);
  pvVar3 = (void *)((long)&c->p + 0x88d0c4);
  lens = &(c->codes).lens;
  uVar8 = 0xffffffff;
  do {
    deflate_find_min_cost_path(c,block_length,cache_ptr);
    uVar7 = deflate_compute_true_cost(c);
    if (uVar8 < (c->p).n.min_improvement_to_continue + uVar7) break;
    memcpy(pvVar2,pvVar3,0x88c);
    deflate_set_costs_from_codes(c,lens);
    local_44 = local_44 - 1;
    uVar8 = uVar7;
  } while (local_44 != 0);
  *used_only_literals = false;
  uVar15 = local_54;
  if (uVar6 < local_54) {
    uVar15 = uVar6;
  }
  if (uVar15 < uVar8) {
    if (uVar6 < local_54) {
      deflate_choose_all_literals(c,block_begin,block_length);
      deflate_set_costs_from_codes(c,lens);
      sequences = &seq_;
      *used_only_literals = true;
      seq_.litrunlen_and_length = block_length;
      goto LAB_00106f7b;
    }
    deflate_set_costs_from_codes(c,&(c->static_codes).lens);
    deflate_find_min_cost_path(c,block_length,cache_ptr);
  }
  else if (uVar8 + (c->p).n.min_bits_to_use_nonfinal_path <= uVar7) {
    memcpy(pvVar3,pvVar2,0x88c);
    deflate_find_min_cost_path(c,block_length,cache_ptr);
    deflate_set_costs_from_codes(c,lens);
  }
  sequences = (deflate_sequence *)0x0;
LAB_00106f7b:
  deflate_flush_block(c,os,block_begin,block_length,sequences,is_final_block);
  return;
}

Assistant:

static void
deflate_optimize_and_flush_block(struct libdeflate_compressor *c,
				 struct deflate_output_bitstream *os,
				 const u8 *block_begin, u32 block_length,
				 const struct lz_match *cache_ptr,
				 bool is_first_block, bool is_final_block,
				 bool *used_only_literals)
{
	unsigned num_passes_remaining = c->p.n.max_optim_passes;
	u32 best_true_cost = UINT32_MAX;
	u32 true_cost;
	u32 only_lits_cost;
	u32 static_cost = UINT32_MAX;
	struct deflate_sequence seq_;
	struct deflate_sequence *seq = NULL;
	u32 i;

	/*
	 * On some data, using only literals (no matches) ends up being better
	 * than what the iterative optimization algorithm produces.  Therefore,
	 * consider using only literals.
	 */
	deflate_choose_all_literals(c, block_begin, block_length);
	only_lits_cost = deflate_compute_true_cost(c);

	/*
	 * Force the block to really end at the desired length, even if some
	 * matches extend beyond it.
	 */
	for (i = block_length;
	     i <= MIN(block_length - 1 + DEFLATE_MAX_MATCH_LEN,
		      ARRAY_LEN(c->p.n.optimum_nodes) - 1); i++)
		c->p.n.optimum_nodes[i].cost_to_end = 0x80000000;

	/*
	 * Sometimes a static Huffman block ends up being cheapest, particularly
	 * if the block is small.  So, if the block is sufficiently small, find
	 * the optimal static block solution and remember its cost.
	 */
	if (block_length <= c->p.n.max_len_to_optimize_static_block) {
		/* Save c->p.n.costs temporarily. */
		c->p.n.costs_saved = c->p.n.costs;

		deflate_set_costs_from_codes(c, &c->static_codes.lens);
		deflate_find_min_cost_path(c, block_length, cache_ptr);
		static_cost = c->p.n.optimum_nodes[0].cost_to_end / BIT_COST;
		static_cost += 7; /* for the end-of-block symbol */

		/* Restore c->p.n.costs. */
		c->p.n.costs = c->p.n.costs_saved;
	}

	/* Initialize c->p.n.costs with default costs. */
	deflate_set_initial_costs(c, block_begin, block_length, is_first_block);

	do {
		/*
		 * Find the minimum-cost path for this pass.
		 * Also set c->freqs and c->codes to match the path.
		 */
		deflate_find_min_cost_path(c, block_length, cache_ptr);

		/*
		 * Compute the exact cost of the block if the path were to be
		 * used.  Note that this differs from
		 * c->p.n.optimum_nodes[0].cost_to_end in that true_cost uses
		 * the actual Huffman codes instead of c->p.n.costs.
		 */
		true_cost = deflate_compute_true_cost(c);

		/*
		 * If the cost didn't improve much from the previous pass, then
		 * doing more passes probably won't be helpful, so stop early.
		 */
		if (true_cost + c->p.n.min_improvement_to_continue >
		    best_true_cost)
			break;

		best_true_cost = true_cost;

		/* Save the cost model that gave 'best_true_cost'. */
		c->p.n.costs_saved = c->p.n.costs;

		/* Update the cost model from the Huffman codes. */
		deflate_set_costs_from_codes(c, &c->codes.lens);

	} while (--num_passes_remaining);

	*used_only_literals = false;
	if (MIN(only_lits_cost, static_cost) < best_true_cost) {
		if (only_lits_cost < static_cost) {
			/* Using only literals ended up being best! */
			deflate_choose_all_literals(c, block_begin, block_length);
			deflate_set_costs_from_codes(c, &c->codes.lens);
			seq_.litrunlen_and_length = block_length;
			seq = &seq_;
			*used_only_literals = true;
		} else {
			/* Static block ended up being best! */
			deflate_set_costs_from_codes(c, &c->static_codes.lens);
			deflate_find_min_cost_path(c, block_length, cache_ptr);
		}
	} else if (true_cost >=
		   best_true_cost + c->p.n.min_bits_to_use_nonfinal_path) {
		/*
		 * The best solution was actually from a non-final optimization
		 * pass, so recover and use the min-cost path from that pass.
		 */
		c->p.n.costs = c->p.n.costs_saved;
		deflate_find_min_cost_path(c, block_length, cache_ptr);
		deflate_set_costs_from_codes(c, &c->codes.lens);
	}
	deflate_flush_block(c, os, block_begin, block_length, seq,
			    is_final_block);
}